

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O0

bool __thiscall
Kernel::InterpretedLiteralEvaluator::RealEvaluator::tryEvaluateBinaryPred
          (RealEvaluator *this,Interpretation op,Value *arg1,Value *arg2,bool *res)

{
  bool bVar1;
  RealConstantType *rhs;
  int in_ESI;
  RealConstantType *in_R8;
  bool local_1;
  
  rhs = (RealConstantType *)(ulong)(in_ESI - 0x13);
  switch(rhs) {
  case (RealConstantType *)0x0:
    bVar1 = Kernel::operator>(in_R8,rhs);
    *(bool *)&(in_R8->super_RationalConstantType)._num._val[0]._mp_alloc = bVar1;
    local_1 = true;
    break;
  case (RealConstantType *)0x1:
    bVar1 = operator>=(in_R8,rhs);
    *(bool *)&(in_R8->super_RationalConstantType)._num._val[0]._mp_alloc = bVar1;
    local_1 = true;
    break;
  case (RealConstantType *)0x2:
    bVar1 = Kernel::operator<(in_R8,rhs);
    *(bool *)&(in_R8->super_RationalConstantType)._num._val[0]._mp_alloc = bVar1;
    local_1 = true;
    break;
  case (RealConstantType *)0x3:
    bVar1 = operator<=(in_R8,rhs);
    *(bool *)&(in_R8->super_RationalConstantType)._num._val[0]._mp_alloc = bVar1;
    local_1 = true;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

virtual bool tryEvaluateBinaryPred(Interpretation op, const Value& arg1,
      const Value& arg2, bool& res)
  {
    switch(op) {
    case Theory::REAL_GREATER:
      res = arg1>arg2;
      return true;
    case Theory::REAL_GREATER_EQUAL:
      res = arg1>=arg2;
      return true;
    case Theory::REAL_LESS:
      res = arg1<arg2;
      return true;
    case Theory::REAL_LESS_EQUAL:
      res = arg1<=arg2;
      return true;
    default:
      return false;
    }
  }